

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lock.cpp
# Opt level: O0

bool __thiscall Threading::Event::_Reset(Event *this)

{
  int iVar1;
  undefined1 local_30 [4];
  int retValue;
  __pthread_cleanup_class __clframe;
  bool isOkay;
  Event *this_local;
  
  __clframe.__cancel_type._3_1_ = 0;
  __pthread_cleanup_class::__pthread_cleanup_class
            ((__pthread_cleanup_class *)local_30,pthread_mutex_unlock,this);
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    this[0x29] = (Event)0x0;
    pthread_cond_broadcast((pthread_cond_t *)(this + 0x30));
    __clframe.__cancel_type._3_1_ = 1;
  }
  __pthread_cleanup_class::__setdoit((__pthread_cleanup_class *)local_30,(uint)(iVar1 == 0));
  __pthread_cleanup_class::~__pthread_cleanup_class((__pthread_cleanup_class *)local_30);
  return (bool)(__clframe.__cancel_type._3_1_ & 1);
}

Assistant:

bool Threading::Event::_Reset() volatile
{
  #ifndef _POSIX
    unsigned portLONG ulVar = 0;
    // Instant wait of the state but only one value in the queue
    portBASE_TYPE  result = xQueueReceive(xQueue, &ulVar, 0);
    // Don't care of the state of the queue
    return true;
  #else
    bool isOkay = false;
    // Install clean up handlers
    pthread_cleanup_push((PThreadVoid)pthread_mutex_unlock, (void *) &event);
    int retValue = pthread_mutex_lock((HMUTEX*)&event);
    if (retValue == 0)
    {
        state = false;
        pthread_cond_broadcast((pthread_cond_t*)&condition);
        isOkay = true;
    }
    // Unlock the mutex here
    pthread_cleanup_pop(retValue == 0);
    return isOkay;
  #endif
}